

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O3

void bench(llama_sampler *cnstr,char *cnstr_name,
          vector<llama_token_data,_std::allocator<llama_token_data>_> *data,int n_iter)

{
  pointer plVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  int iVar5;
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur;
  llama_token_data_array cur_p_1;
  llama_token_data_array cur_p;
  vector<llama_token_data,_std::allocator<llama_token_data>_> local_90;
  char *local_78;
  pointer local_70;
  long local_68;
  undefined8 local_60;
  undefined1 local_58;
  pointer local_50;
  long local_48;
  undefined8 local_40;
  undefined1 local_38;
  
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
            (&local_90,
             ((long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
             (allocator_type *)&local_50);
  plVar1 = (data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)plVar1;
  if (sVar4 != 0) {
    memmove(local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl
            .super__Vector_impl_data._M_start,plVar1,sVar4);
  }
  local_50 = local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_48 = ((long)local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  llama_sampler_apply(cnstr);
  llama_sampler_reset(cnstr);
  local_78 = cnstr_name;
  lVar2 = ggml_time_us();
  iVar5 = 0x20;
  do {
    plVar1 = (data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>)._M_impl
             .super__Vector_impl_data._M_start;
    sVar4 = (long)(data->super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)plVar1;
    if (sVar4 != 0) {
      memmove(local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
              _M_impl.super__Vector_impl_data._M_start,plVar1,sVar4);
    }
    local_70 = local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_68 = ((long)local_90.
                      super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.
                      super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    local_60 = 0xffffffffffffffff;
    local_58 = 0;
    llama_sampler_apply(cnstr,&local_70);
    llama_sampler_reset(cnstr);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar3 = ggml_time_us();
  llama_sampler_free(cnstr);
  printf("%-43s: %8.3f us/iter\n",(double)((float)(lVar3 - lVar2) * 0.03125),local_78);
  if (local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<llama_token_data,_std::allocator<llama_token_data>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void bench(llama_sampler * cnstr, const char * cnstr_name, const std::vector<llama_token_data> & data, int n_iter) {
    std::vector<llama_token_data> cur(data.size());
    std::copy(data.begin(), data.end(), cur.begin());
    llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
    llama_sampler_apply(cnstr, &cur_p);
    llama_sampler_reset(cnstr);
    const int64_t t_start = ggml_time_us();
    for (int i = 0; i < n_iter; i++) {
        std::copy(data.begin(), data.end(), cur.begin());
        llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
        llama_sampler_apply(cnstr, &cur_p);
        llama_sampler_reset(cnstr);
    }
    const int64_t t_end = ggml_time_us();
    llama_sampler_free(cnstr);
    printf("%-43s: %8.3f us/iter\n", cnstr_name, (t_end - t_start) / (float)n_iter);
}